

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O3

void SpookyHash::Hash128(void *message,size_t length,uint64 *hash1,uint64 *hash2)

{
  long *__src;
  long lVar1;
  ulong uVar2;
  uint64 uVar3;
  uint64 uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64 uVar7;
  ulong uVar8;
  uint64 uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64 uVar12;
  ulong uVar13;
  uint64 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint64 uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint64 uVar24;
  ulong uVar25;
  ulong uVar26;
  uint64 buf [12];
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  undefined7 local_40;
  
  if (0xbf < length) {
    uVar4 = *hash1;
    uVar3 = *hash2;
    uVar10 = 0xdeadbeefdeadbeef;
    lVar1 = (length / 0x60) * 0x60;
    uVar16 = length % 0x60;
    __src = (long *)((long)message + lVar1);
    if (lVar1 < 1) {
      uVar20 = 0xdeadbeefdeadbeef;
      uVar21 = 0xdeadbeefdeadbeef;
      uVar2 = 0xdeadbeefdeadbeef;
      uVar7 = uVar4;
      uVar9 = uVar3;
      uVar12 = uVar3;
      uVar14 = uVar4;
      uVar19 = uVar4;
      uVar24 = uVar3;
    }
    else {
      uVar2 = 0xdeadbeefdeadbeef;
      uVar21 = 0xdeadbeefdeadbeef;
      uVar20 = 0xdeadbeefdeadbeef;
      uVar7 = uVar4;
      uVar9 = uVar3;
      uVar12 = uVar3;
      uVar14 = uVar4;
      uVar19 = uVar4;
      uVar24 = uVar3;
      do {
        uVar5 = uVar7 + *message;
        uVar11 = (uVar10 ^ uVar5) + uVar9;
        uVar10 = uVar9 + *(long *)((long)message + 8);
        uVar18 = uVar19 ^ uVar11;
        uVar6 = ((uVar5 >> 0x35 | uVar5 * 0x800) ^ uVar10) + (uVar20 ^ uVar12);
        uVar20 = (uVar20 ^ uVar12) + *(long *)((long)message + 0x10);
        uVar5 = uVar24 ^ uVar6;
        uVar8 = ((uVar10 >> 0x20 | uVar10 << 0x20) ^ uVar20) + uVar18;
        uVar18 = uVar18 + *(long *)((long)message + 0x18);
        uVar21 = uVar21 ^ uVar8;
        uVar20 = ((uVar20 >> 0x15 | uVar20 << 0x2b) ^ uVar18) + uVar5;
        uVar5 = uVar5 + *(long *)((long)message + 0x20);
        uVar19 = ((uVar18 >> 0x21 | uVar18 * 0x80000000) ^ uVar5) + uVar21;
        uVar21 = uVar21 + *(long *)((long)message + 0x28);
        uVar24 = ((uVar5 >> 0x2f | uVar5 * 0x20000) ^ uVar21) + (uVar4 ^ uVar20);
        uVar10 = (uVar4 ^ uVar20) + *(long *)((long)message + 0x30);
        uVar21 = ((uVar21 >> 0x24 | uVar21 * 0x10000000) ^ uVar10) + (uVar3 ^ uVar19);
        uVar5 = (uVar3 ^ uVar19) + *(long *)((long)message + 0x38);
        uVar4 = ((uVar10 >> 0x19 | uVar10 << 0x27) ^ uVar5) + (uVar2 ^ uVar24);
        uVar10 = (uVar2 ^ uVar24) + *(long *)((long)message + 0x40);
        uVar3 = ((uVar5 >> 7 | uVar5 << 0x39) ^ uVar10) + (uVar14 ^ uVar21);
        uVar18 = (uVar14 ^ uVar21) + *(long *)((long)message + 0x48);
        uVar11 = uVar11 ^ uVar3;
        uVar2 = ((uVar10 >> 9 | uVar10 << 0x37) ^ uVar18) + (uVar12 ^ uVar4);
        uVar5 = (uVar12 ^ uVar4) + *(long *)((long)message + 0x50);
        uVar7 = uVar6 ^ uVar2;
        uVar14 = ((uVar18 >> 10 | uVar18 << 0x36) ^ uVar5) + uVar11;
        uVar11 = uVar11 + *(long *)((long)message + 0x58);
        message = (void *)((long)message + 0x60);
        uVar9 = uVar8 ^ uVar14;
        uVar10 = uVar11 >> 0x12 | uVar11 << 0x2e;
        uVar12 = ((uVar5 >> 0x2a | uVar5 * 0x400000) ^ uVar11) + uVar7;
      } while (message < __src);
    }
    memcpy(&local_98,__src,uVar16);
    memset((void *)((long)&local_98 + uVar16),0,0x60 - uVar16);
    uVar6 = uVar7 + local_98;
    uVar5 = (uVar10 ^ uVar6) + uVar9;
    uVar8 = uVar9 + local_90;
    uVar11 = uVar19 ^ uVar5;
    uVar10 = ((uVar6 >> 0x35 | uVar6 * 0x800) ^ uVar8) + (uVar20 ^ uVar12);
    uVar6 = (uVar20 ^ uVar12) + local_88;
    uVar18 = uVar24 ^ uVar10;
    uVar20 = ((uVar8 >> 0x20 | uVar8 << 0x20) ^ uVar6) + uVar11;
    uVar11 = uVar11 + local_80;
    uVar21 = uVar21 ^ uVar20;
    uVar6 = ((uVar6 >> 0x15 | uVar6 << 0x2b) ^ uVar11) + uVar18;
    uVar18 = uVar18 + local_78;
    uVar13 = uVar4 ^ uVar6;
    uVar8 = ((uVar11 >> 0x21 | uVar11 * 0x80000000) ^ uVar18) + uVar21;
    uVar21 = uVar21 + local_70;
    uVar15 = uVar3 ^ uVar8;
    uVar11 = ((uVar18 >> 0x2f | uVar18 * 0x20000) ^ uVar21) + uVar13;
    uVar13 = uVar13 + local_68;
    uVar2 = uVar2 ^ uVar11;
    uVar18 = ((uVar21 >> 0x24 | uVar21 * 0x10000000) ^ uVar13) + uVar15;
    uVar15 = uVar15 + local_60;
    uVar21 = uVar14 ^ uVar18;
    uVar13 = ((uVar13 >> 0x19 | uVar13 << 0x27) ^ uVar15) + uVar2;
    uVar2 = uVar2 + local_58;
    uVar22 = uVar12 ^ uVar13;
    uVar15 = ((uVar15 >> 7 | uVar15 << 0x39) ^ uVar2) + uVar21;
    uVar21 = uVar21 + local_50;
    uVar5 = uVar5 ^ uVar15;
    uVar17 = ((uVar2 >> 9 | uVar2 << 0x37) ^ uVar21) + uVar22;
    uVar22 = uVar22 + local_48;
    uVar10 = uVar10 ^ uVar17;
    uVar21 = ((uVar21 >> 10 | uVar21 << 0x36) ^ uVar22) + uVar5;
    uVar5 = uVar5 + CONCAT17((char)uVar16,local_40);
    uVar20 = uVar20 ^ uVar21;
    uVar25 = (uVar5 >> 0x12 | uVar5 << 0x2e) + uVar20;
    uVar6 = uVar6 ^ uVar25;
    uVar16 = uVar10 + uVar6;
    uVar8 = uVar8 ^ uVar16;
    uVar2 = (uVar20 >> 0x14 | uVar20 << 0x2c) + uVar8;
    uVar11 = uVar11 ^ uVar2;
    uVar20 = (uVar6 >> 0x31 | uVar6 << 0xf) + uVar11;
    uVar18 = uVar18 ^ uVar20;
    uVar6 = (uVar8 >> 0x1e | uVar8 << 0x22) + uVar18;
    uVar13 = uVar13 ^ uVar6;
    uVar11 = (uVar11 >> 0x2b | uVar11 << 0x15) + uVar13;
    uVar15 = uVar15 ^ uVar11;
    uVar18 = (uVar18 >> 0x1a | uVar18 << 0x26) + uVar15;
    uVar17 = uVar17 ^ uVar18;
    uVar13 = (uVar13 >> 0x1f | uVar13 << 0x21) + uVar17;
    uVar21 = uVar21 ^ uVar13;
    uVar15 = (uVar15 >> 0x36 | uVar15 << 10) + uVar21;
    uVar10 = ((uVar22 >> 0x2a | uVar22 * 0x400000) ^ uVar5) + uVar10 ^ uVar15;
    uVar17 = (uVar17 >> 0x33 | uVar17 << 0xd) + uVar10;
    uVar25 = uVar25 ^ uVar17;
    uVar5 = (uVar21 >> 0x1a | uVar21 << 0x26) + uVar25;
    uVar16 = uVar16 ^ uVar5;
    uVar23 = (uVar10 >> 0xb | uVar10 << 0x35) + uVar16;
    uVar2 = uVar2 ^ uVar23;
    uVar26 = (uVar25 >> 0x16 | uVar25 << 0x2a) + uVar2;
    uVar20 = uVar20 ^ uVar26;
    uVar22 = (uVar16 >> 10 | uVar16 << 0x36) + uVar20;
    uVar6 = uVar6 ^ uVar22;
    uVar25 = (uVar2 >> 0x14 | uVar2 << 0x2c) + uVar6;
    uVar11 = uVar11 ^ uVar25;
    uVar8 = (uVar20 >> 0x31 | uVar20 << 0xf) + uVar11;
    uVar18 = uVar18 ^ uVar8;
    uVar20 = (uVar6 >> 0x1e | uVar6 << 0x22) + uVar18;
    uVar13 = uVar13 ^ uVar20;
    uVar10 = (uVar11 >> 0x2b | uVar11 << 0x15) + uVar13;
    uVar15 = uVar15 ^ uVar10;
    uVar18 = (uVar18 >> 0x1a | uVar18 << 0x26) + uVar15;
    uVar17 = uVar17 ^ uVar18;
    uVar21 = (uVar13 >> 0x1f | uVar13 << 0x21) + uVar17;
    uVar5 = uVar5 ^ uVar21;
    uVar16 = (uVar15 >> 0x36 | uVar15 << 10) + uVar5;
    uVar23 = uVar23 ^ uVar16;
    uVar11 = (uVar17 >> 0x33 | uVar17 << 0xd) + uVar23;
    uVar26 = uVar26 ^ uVar11;
    uVar5 = (uVar5 >> 0x1a | uVar5 << 0x26) + uVar26;
    uVar22 = uVar22 ^ uVar5;
    uVar2 = (uVar23 >> 0xb | uVar23 << 0x35) + uVar22;
    uVar25 = uVar25 ^ uVar2;
    uVar15 = (uVar26 >> 0x16 | uVar26 << 0x2a) + uVar25;
    uVar8 = uVar8 ^ uVar15;
    uVar6 = (uVar22 >> 10 | uVar22 << 0x36) + uVar8;
    uVar20 = uVar20 ^ uVar6;
    uVar13 = (uVar25 >> 0x14 | uVar25 << 0x2c) + uVar20;
    uVar10 = uVar10 ^ uVar13;
    uVar18 = (uVar8 >> 0x31 | uVar8 << 0xf) + uVar10 ^ uVar18;
    uVar21 = (uVar20 >> 0x1e | uVar20 << 0x22) + uVar18 ^ uVar21;
    uVar16 = (uVar10 >> 0x2b | uVar10 << 0x15) + uVar21 ^ uVar16;
    uVar11 = (uVar18 >> 0x1a | uVar18 << 0x26) + uVar16 ^ uVar11;
    uVar5 = (uVar21 >> 0x1f | uVar21 << 0x21) + uVar11 ^ uVar5;
    uVar2 = (uVar16 >> 0x36 | uVar16 << 10) + uVar5 ^ uVar2;
    uVar6 = ((uVar11 >> 0x33 | uVar11 << 0xd) + uVar2 ^ uVar15) + (uVar5 >> 0x1a | uVar5 << 0x26) ^
            uVar6;
    *hash1 = uVar6 >> 10 | uVar6 << 0x36;
    *hash2 = (uVar2 >> 0xb | uVar2 << 0x35) + uVar6 ^ uVar13;
    return;
  }
  Short(message,length,hash1,hash2);
  return;
}

Assistant:

void SpookyHash::Hash128(
    const void *message, 
    size_t length, 
    uint64 *hash1, 
    uint64 *hash2)
{
    if (length < sc_bufSize)
    {
        Short(message, length, hash1, hash2);
        return;
    }

    uint64 h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11;
    uint64 buf[sc_numVars];
    uint64 *end;
    union 
    { 
        const uint8 *p8; 
        uint64 *p64; 
        size_t i; 
    } u;
    size_t remainder;
    
    h0=h3=h6=h9  = *hash1;
    h1=h4=h7=h10 = *hash2;
    h2=h5=h8=h11 = sc_const;
    
    u.p8 = (const uint8 *)message;
    end = u.p64 + (length/sc_blockSize)*sc_numVars;

    // handle all whole sc_blockSize blocks of bytes
    if (ALLOW_UNALIGNED_READS || ((u.i & 0x7) == 0))
    {
        while (u.p64 < end)
        { 
            Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }
    else
    {
        while (u.p64 < end)
        {
            memcpy(buf, u.p64, sc_blockSize);
            Mix(buf, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }

    // handle the last partial block of sc_blockSize bytes
    remainder = (length - ((const uint8 *)end-(const uint8 *)message));
    memcpy(buf, end, remainder);
    memset(((uint8 *)buf)+remainder, 0, sc_blockSize-remainder);
    ((uint8 *)buf)[sc_blockSize-1] = remainder;
    Mix(buf, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
    
    // do some final mixing 
    End(h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
    *hash1 = h0;
    *hash2 = h1;
}